

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
DeleteSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int start,int num)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  
  if (0 < num) {
    uVar3 = (ulong)(uint)num;
    lVar2 = (long)start;
    do {
      if ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
        puVar1 = (undefined8 *)((this->super_RepeatedPtrFieldBase).rep_)->elements[lVar2];
        if ((puVar1 != (undefined8 *)0x0) && ((undefined8 *)*puVar1 != puVar1 + 2)) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      uVar3 = uVar3 - 1;
      lVar2 = lVar2 + 1;
    } while (uVar3 != 0);
    if (0 < num) {
      internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
      return;
    }
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::DeleteSubrange(int start, int num) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());
  for (int i = 0; i < num; ++i) {
    RepeatedPtrFieldBase::Delete<TypeHandler>(start + i);
  }
  ExtractSubrange(start, num, NULL);
}